

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O2

string * handle_server_list_long_page_abi_cxx11_(string_view param_1)

{
  Server *pSVar1;
  char cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long lVar3;
  long local_68;
  long local_60;
  string local_50;
  
  RenX::getCore();
  RenX::Core::getServers();
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (this->_M_dataplus)._M_p = (pointer)&this->field_2;
  this->_M_string_length = 0;
  (this->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (this,(local_60 - local_68) * 0x20);
  local_50._M_dataplus._M_p = (pointer)0x1;
  local_50._M_string_length = 0x1154f5;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)&local_50);
  lVar3 = 0;
  do {
    if (lVar3 == local_60 - local_68 >> 3) {
LAB_001105d9:
      for (; lVar3 != local_60 - local_68 >> 3; lVar3 = lVar3 + 1) {
        pSVar1 = *(Server **)(local_68 + lVar3 * 8);
        cVar2 = RenX::Server::isConnected();
        if (cVar2 != '\0') {
          cVar2 = RenX::Server::isFullyConnected();
          if (cVar2 != '\0') {
            local_50._M_dataplus._M_p = (pointer)0x3;
            local_50._M_string_length = 0x1155ad;
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)&local_50)
            ;
            RenX_ServerListPlugin::server_as_long_json_abi_cxx11_(&local_50,&pluginInstance,pSVar1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (this,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
      local_50._M_dataplus._M_p = (pointer)0x2;
      local_50._M_string_length = 0x1155b1;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)&local_50);
      std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
                ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_68);
      return this;
    }
    pSVar1 = *(Server **)(local_68 + lVar3 * 8);
    cVar2 = RenX::Server::isConnected();
    if (cVar2 != '\0') {
      cVar2 = RenX::Server::isFullyConnected();
      if (cVar2 != '\0') {
        local_50._M_dataplus._M_p = (pointer)0x2;
        local_50._M_string_length = 0x1155ae;
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)&local_50);
        RenX_ServerListPlugin::server_as_long_json_abi_cxx11_(&local_50,&pluginInstance,pSVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        lVar3 = lVar3 + 1;
        goto LAB_001105d9;
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

std::string* handle_server_list_long_page(std::string_view) {
	const auto& servers = RenX::getCore()->getServers();
	size_t index = 0;
	RenX::Server *server;
	std::string *server_list_long_json = new std::string;
	server_list_long_json->reserve(256 * servers.size());

	// regenerate server_list_json

	*server_list_long_json = "["sv;

	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			*server_list_long_json += "\n\t"sv;
			*server_list_long_json += pluginInstance.server_as_long_json(*server);
			++index;
			break;
		}
		++index;
	}
	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			*server_list_long_json += ",\n\t"sv;
			*server_list_long_json += pluginInstance.server_as_long_json(*server);
		}
		++index;
	}

	*server_list_long_json += "\n]"sv;

	return server_list_long_json;
}